

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall CVmImagePool::seek_page_ofs(CVmImagePool *this,pool_ofs_t ofs)

{
  ulong idx;
  CVmImagePool_pg *pCVar1;
  uint in_ESI;
  CVmImagePool *in_RDI;
  CVmImagePool_pg *info;
  ulong page_idx;
  
  idx = (ulong)in_ESI / in_RDI->page_size_;
  if (in_RDI->page_count_ <= idx) {
    err_throw(0);
  }
  pCVar1 = get_page_info(in_RDI,idx);
  if (pCVar1->seek_pos == 0) {
    err_throw(0);
  }
  (*in_RDI->fp_->_vptr_CVmImageFile[7])(in_RDI->fp_,pCVar1->seek_pos);
  return;
}

Assistant:

void CVmImagePool::seek_page_ofs(pool_ofs_t ofs)
{
    ulong page_idx;
    CVmImagePool_pg *info;
    
    /* 
     *   get the page index - pages are all of a fixed length, so we can
     *   find the page index simply by dividing the offset by the page
     *   size 
     */
    page_idx = ofs / page_size_;

    /* make sure the page is valid */
    if (page_idx >= page_count_)
        err_throw(VMERR_LOAD_BAD_PAGE_IDX);

    /* make sure the page has been defined */
    info = get_page_info(page_idx);

    /* make sure this page's information has been loaded */
    if (info->seek_pos == 0)
        err_throw(VMERR_LOAD_UNDEF_PAGE);
    
    /* seek to this block's position in the file */
    fp_->seek(info->seek_pos);
}